

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_4_suite::test_same(void)

{
  undefined8 local_110;
  value_type local_108;
  undefined4 local_fc;
  size_type local_f8;
  undefined1 local_ee;
  undefined1 local_ed [2];
  undefined1 local_eb;
  undefined1 local_ea [2];
  undefined8 local_e8;
  value_type local_e0;
  undefined4 local_d4;
  size_type local_d0 [2];
  undefined8 local_c0;
  value_type local_b8;
  undefined4 local_ac;
  size_type local_a8 [2];
  undefined8 local_98;
  value_type local_90;
  undefined4 local_84;
  size_type local_80 [2];
  undefined8 local_70;
  value_type local_68;
  undefined4 local_5c;
  size_type local_58 [2];
  undefined1 local_48 [8];
  moment<double,_4> filter;
  
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,1.0);
  local_58[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::size
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe0,"void mean_double_4_suite::test_same()",local_58,&local_5c);
  local_68 = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_70 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe1,"void mean_double_4_suite::test_same()",&local_68,&local_70);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,1.0);
  local_80[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::size
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_84 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe3,"void mean_double_4_suite::test_same()",local_80,&local_84);
  local_90 = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_98 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe4,"void mean_double_4_suite::test_same()",&local_90,&local_98);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,1.0);
  local_a8[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::size
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_ac = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe6,"void mean_double_4_suite::test_same()",local_a8,&local_ac);
  local_b8 = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_c0 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe7,"void mean_double_4_suite::test_same()",&local_b8,&local_c0);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,1.0);
  local_d0[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::size
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_d4 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe9,"void mean_double_4_suite::test_same()",local_d0,&local_d4);
  local_e0 = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_e8 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xea,"void mean_double_4_suite::test_same()",&local_e0,&local_e8);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,1.0);
  local_ea[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::empty
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_eb = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xec,"void mean_double_4_suite::test_same()",local_ea,&local_eb);
  local_ed[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::full
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_ee = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xed,"void mean_double_4_suite::test_same()",local_ed,&local_ee);
  local_f8 = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_fc = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xee,"void mean_double_4_suite::test_same()",&local_f8,&local_fc);
  local_108 = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                        ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_110 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xef,"void mean_double_4_suite::test_same()",&local_108,&local_110);
  return;
}

Assistant:

void test_same()
{
    window::moment<double, 4> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 3);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 4);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
}